

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmAbc.c
# Opt level: O1

Mig_Man_t * Mig_ManCreate(void *pGia)

{
  char *__s;
  long lVar1;
  long lVar2;
  ulong uVar3;
  void *pvVar4;
  int iVar5;
  Mig_Man_t *p;
  size_t sVar6;
  char *__dest;
  Mig_Fan_t *pMVar7;
  Mig_Obj_t *pMVar8;
  uint *puVar9;
  ulong uVar10;
  Mig_Fan_t MVar11;
  uint uVar12;
  Mig_Fan_t MVar13;
  long lVar14;
  uint uVar15;
  Mig_Fan_t MVar16;
  uint uVar17;
  Mig_Fan_t MVar18;
  Mig_Fan_t MVar19;
  uint uVar20;
  long lVar21;
  
  __dest = (char *)0x0;
  p = Mig_ManStart();
  __s = *pGia;
  if (__s != (char *)0x0) {
    sVar6 = strlen(__s);
    __dest = (char *)malloc(sVar6 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  *(undefined4 *)(*(long *)((long)pGia + 0x20) + 8) = 0;
  uVar10 = (ulong)*(uint *)((long)pGia + 0x18);
  if (1 < (int)*(uint *)((long)pGia + 0x18)) {
    lVar14 = 1;
    lVar21 = 0x14;
    do {
      lVar1 = *(long *)((long)pGia + 0x20);
      lVar2 = *(long *)((long)pGia + 0x28);
      if ((lVar2 == 0) || (*(int *)(lVar2 + lVar14 * 4) == 0)) {
        uVar10 = *(ulong *)(lVar1 + -8 + lVar21);
        uVar20 = (uint)uVar10;
        iVar5 = (int)(uVar10 & 0x1fffffff);
        uVar12 = (uint)(uVar10 >> 0x20);
        if (((uVar10 & 0x1fffffff) == 0x1fffffff || (int)uVar20 < 0) ||
           ((uVar12 & 0x1fffffff) <= (uVar20 & 0x1fffffff))) {
          if (iVar5 == 0x1fffffff || (int)uVar20 < 0) {
            if ((~uVar20 & 0x9fffffff) == 0) {
              pMVar8 = Mig_ManAppendObj(p);
              if ((uint)pMVar8->pFans[1] < 0xfffffffe) {
LAB_008c5c17:
                __assert_fail("Mig_FanIsNone(p, 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                              ,0x95,"void Mig_ObjSetCioId(Mig_Obj_t *, int)");
              }
              uVar12 = (p->vCis).nSize;
              if (0x7ffffffe < uVar12) {
LAB_008c5bf8:
                __assert_fail("v >= 0 && v < MIG_NONE",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                              ,0x81,"int Mig_FanSetId(Mig_Obj_t *, int, int)");
              }
              pMVar8->pFans[2] = (Mig_Fan_t)(((uint)pMVar8->pFans[2] & 1) + uVar12 * 2);
              Vec_IntPush(&p->vCis,(uint)pMVar8->pFans[3] >> 1);
              MVar11 = pMVar8->pFans[3];
            }
            else {
              if ((-1 < (int)uVar20) || (iVar5 == 0x1fffffff)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmAbc.c"
                              ,0x68,"Mig_Man_t *Mig_ManCreate(void *)");
              }
              uVar12 = *(uint *)(lVar1 + (ulong)(uint)(iVar5 << 2) * -3 + lVar21);
              if ((int)uVar12 < 0) goto LAB_008c5b3e;
              uVar15 = uVar12 >> 1;
              if (p->nObjs <= (int)uVar15) {
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                              ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
              }
              if ((p->vPages).nSize <= (int)(uVar12 >> 0xd)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pvVar4 = (p->vPages).pArray[uVar12 >> 0xd];
              uVar10 = (ulong)((uVar15 & 0xfff) << 4);
              if (((0xfffffffd < *(uint *)((long)pvVar4 + uVar10 + 4)) &&
                  (puVar9 = (uint *)((long)pvVar4 + uVar10), puVar9[2] < 0xfffffffe)) &&
                 (*puVar9 < 0xfffffffe)) {
                __assert_fail("!Mig_ObjIsCo(Mig_ManObj(p, Abc_Lit2Var(iLit0)))",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                              ,0xf8,"int Mig_ManAppendCo(Mig_Man_t *, int)");
              }
              pMVar8 = Mig_ManAppendObj(p);
              uVar17 = (uint)pMVar8->pFans[3] >> 1;
              if (uVar17 <= uVar15) goto LAB_008c5b1f;
              pMVar8->pFans[0] = (Mig_Fan_t)(uVar20 >> 0x1d & 1 ^ uVar12);
              if ((uint)pMVar8->pFans[1] < 0xfffffffe) goto LAB_008c5c17;
              uVar12 = (p->vCos).nSize;
              if (0x7ffffffe < uVar12) goto LAB_008c5bf8;
              pMVar8->pFans[2] = (Mig_Fan_t)(((uint)pMVar8->pFans[2] & 1) + uVar12 * 2);
              Vec_IntPush(&p->vCos,uVar17);
              MVar11 = pMVar8->pFans[3];
            }
            goto LAB_008c5ad0;
          }
          uVar20 = *(uint *)(lVar1 + (ulong)(uint)(iVar5 << 2) * -3 + lVar21);
          if (((int)uVar20 < 0) ||
             (uVar15 = *(uint *)(lVar1 + (ulong)((uint)(uVar10 >> 0x1e) & 0x7ffffffc) * -3 + lVar21)
             , (int)uVar15 < 0)) goto LAB_008c5b3e;
          MVar18 = (Mig_Fan_t)(uVar20 ^ (uint)(uVar10 >> 0x1d) & 1);
          MVar13 = (Mig_Fan_t)(uVar15 ^ uVar12 >> 0x1d & 1);
          pMVar7 = Mig_ManAppendObj(p)->pFans;
          if (MVar18 == MVar13) {
            __assert_fail("iLit0 != iLit1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                          ,0x109,"int Mig_ManAppendAnd(Mig_Man_t *, int, int)");
          }
          MVar19 = MVar13;
          if ((int)MVar18 < (int)MVar13) {
            MVar19 = MVar18;
          }
          if ((int)MVar19 < 0) goto LAB_008c5b1f;
          MVar11 = pMVar7[3];
          uVar12 = (uint)MVar11 >> 1;
          if (uVar12 <= (uint)MVar19 >> 1) goto LAB_008c5b1f;
          *pMVar7 = MVar19;
          if ((int)MVar13 < (int)MVar18) {
            MVar13 = MVar18;
          }
        }
        else {
          uVar20 = *(uint *)(lVar1 + (ulong)(uint)(iVar5 << 2) * -3 + lVar21);
          if (((int)uVar20 < 0) ||
             (uVar15 = *(uint *)(lVar1 + (ulong)((uint)(uVar10 >> 0x1e) & 0x7ffffffc) * -3 + lVar21)
             , (int)uVar15 < 0)) goto LAB_008c5b3e;
          MVar18 = (Mig_Fan_t)(uVar20 ^ (uint)(uVar10 >> 0x1d) & 1);
          MVar13 = (Mig_Fan_t)(uVar15 ^ uVar12 >> 0x1d & 1);
          pMVar7 = Mig_ManAppendObj(p)->pFans;
          if (MVar18 == MVar13) {
            __assert_fail("iLit0 != iLit1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                          ,0x111,"int Mig_ManAppendXor(Mig_Man_t *, int, int)");
          }
          if ((((uint)MVar18 | (uint)MVar13) & 1) != 0) {
            __assert_fail("!Abc_LitIsCompl(iLit0) && !Abc_LitIsCompl(iLit1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                          ,0x112,"int Mig_ManAppendXor(Mig_Man_t *, int, int)");
          }
          MVar19 = MVar13;
          if ((int)MVar13 < (int)MVar18) {
            MVar19 = MVar18;
          }
          if ((int)MVar19 < 0) goto LAB_008c5b1f;
          MVar11 = pMVar7[3];
          uVar12 = (uint)MVar11 >> 1;
          if (uVar12 <= (uint)MVar19 >> 1) goto LAB_008c5b1f;
          *pMVar7 = MVar19;
          if ((int)MVar18 < (int)MVar13) {
            MVar13 = MVar18;
          }
        }
        if (((int)MVar13 < 0) || (uVar12 <= (uint)MVar13 >> 1)) {
LAB_008c5b1f:
          __assert_fail("l >= 0 && (l >> 1) < Mig_ObjId(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                        ,0xba,"void Mig_ObjSetFaninLit(Mig_Obj_t *, int, int)");
        }
        pMVar7[1] = MVar13;
      }
      else {
        uVar3 = *(ulong *)(lVar1 + -8 + lVar21);
        uVar12 = *(uint *)(lVar1 + lVar21 + (ulong)(((uint)uVar3 & 0x1fffffff) << 2) * -3);
        if (((int)uVar12 < 0) ||
           (uVar20 = *(uint *)(lVar1 + (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3 + lVar21),
           (int)uVar20 < 0)) {
LAB_008c5b3e:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        if ((int)uVar10 <= lVar14) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar15 = *(uint *)(lVar2 + lVar14 * 4);
        if ((int)uVar15 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        if ((int)uVar10 <= (int)(uVar15 >> 1)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar17 = *(uint *)(lVar1 + 8 + (ulong)(uVar15 >> 1) * 0xc);
        if ((int)uVar17 < 0) goto LAB_008c5b3e;
        MVar18 = (Mig_Fan_t)(uVar20 ^ (uint)(uVar3 >> 0x3d) & 1);
        MVar13 = (Mig_Fan_t)(uVar15 & 1 ^ uVar17);
        pMVar7 = Mig_ManAppendObj(p)->pFans;
        if (((MVar18 == MVar13) ||
            (MVar19 = (Mig_Fan_t)((uint)uVar3 >> 0x1d & 1 ^ uVar12), MVar19 == MVar18)) ||
           (MVar19 == MVar13)) {
          __assert_fail("iLit0 != iLit1 && iLit0 != iCtrl && iLit1 != iCtrl",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                        ,0x11a,"int Mig_ManAppendMux(Mig_Man_t *, int, int, int)");
        }
        if ((((uint)MVar19 & 1) != 0) && (((uint)MVar18 & 1) != 0)) {
          __assert_fail("!Abc_LitIsCompl(iLit0) || !Abc_LitIsCompl(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMig.h"
                        ,0x11b,"int Mig_ManAppendMux(Mig_Man_t *, int, int, int)");
        }
        MVar16 = MVar18;
        if ((int)MVar19 < (int)MVar18) {
          MVar16 = MVar19;
        }
        if ((int)MVar16 < 0) goto LAB_008c5b1f;
        MVar11 = pMVar7[3];
        uVar12 = (uint)MVar11 >> 1;
        if (uVar12 <= (uint)MVar16 >> 1) goto LAB_008c5b1f;
        *pMVar7 = MVar16;
        MVar16 = MVar18;
        if ((int)MVar18 < (int)MVar19) {
          MVar16 = MVar19;
        }
        if ((((int)MVar16 < 0) || (uVar12 <= (uint)MVar16 >> 1)) ||
           (pMVar7[1] = MVar16, uVar12 <= uVar17 >> 1)) goto LAB_008c5b1f;
        pMVar7[2] = (Mig_Fan_t)((uint)MVar13 ^ (uint)((int)MVar18 <= (int)MVar19));
      }
LAB_008c5ad0:
      *(uint *)(lVar1 + lVar21) = (uint)MVar11 & 0xfffffffe;
      lVar14 = lVar14 + 1;
      uVar10 = (ulong)*(int *)((long)pGia + 0x18);
      lVar21 = lVar21 + 0xc;
    } while (lVar14 < (long)uVar10);
  }
  p->nRegs = *(int *)((long)pGia + 0x10);
  if (*(long *)((long)pGia + 0xd0) != 0) {
    Mig_ManCreateChoices(p,(Gia_Man_t *)pGia);
  }
  return p;
}

Assistant:

Mig_Man_t * Mig_ManCreate( void * pGia )
{
    Gia_Man_t * p = (Gia_Man_t *)pGia;
    Mig_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Mig_ManStart();
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsMuxId(p, i) )
            pObj->Value = Mig_ManAppendMux( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin2Copy(p, pObj) );
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Mig_ManAppendXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Mig_ManAppendAnd( pNew, Mig_ObjFanin0Copy(pObj), Mig_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Mig_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Mig_ManAppendCo( pNew, Mig_ObjFanin0Copy(pObj) );
        else assert( 0 );
    }
    Mig_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    if ( Gia_ManHasChoices(p) )
        Mig_ManCreateChoices( pNew, p );
    return pNew;
}